

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float *pfVar2;
  undefined4 *puVar3;
  BVH *bvh;
  size_t sVar4;
  Geometry *pGVar5;
  long lVar6;
  Ref<embree::Geometry> *pRVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vfloat_impl<4> vVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  vbool<4> vVar30;
  size_t sVar31;
  uint uVar32;
  undefined4 uVar33;
  uint uVar34;
  AABBNodeMB4D *node1;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined8 uVar38;
  int iVar39;
  long lVar40;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar41;
  NodeRef root;
  vuint<4> *v;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  NodeRef *pNVar48;
  ulong uVar49;
  QuadMesh *mesh;
  bool bVar50;
  float fVar51;
  undefined4 uVar52;
  float fVar62;
  float fVar65;
  vint4 ai;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar68;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar63;
  undefined4 uVar64;
  float fVar66;
  undefined4 uVar67;
  float fVar69;
  undefined4 uVar70;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar71;
  float fVar83;
  float fVar84;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar85;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar78;
  undefined1 auVar79 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar95;
  float fVar97;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar87;
  undefined1 auVar88 [16];
  undefined4 uVar96;
  undefined4 uVar98;
  float fVar99;
  undefined4 uVar100;
  vfloat_impl<4> vVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar101;
  float fVar102;
  float fVar106;
  float fVar107;
  undefined1 auVar103 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar104;
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar110;
  float fVar113;
  float fVar115;
  vint4 ai_1;
  float fVar117;
  undefined1 auVar111 [16];
  float fVar114;
  float fVar116;
  float fVar118;
  undefined1 auVar112 [16];
  float fVar119;
  float fVar120;
  float fVar125;
  float fVar127;
  vint4 ai_3;
  undefined1 auVar121 [16];
  float fVar129;
  undefined1 auVar122 [16];
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  vint4 bi;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar149;
  float fVar150;
  vint4 bi_3;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar151;
  vfloat_impl<4> vVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  undefined4 uVar153;
  float fVar154;
  float fVar155;
  undefined4 uVar156;
  float fVar157;
  float fVar158;
  undefined4 uVar159;
  float fVar160;
  vint4 bi_1;
  float fVar161;
  undefined4 uVar162;
  float fVar163;
  uint uVar164;
  float fVar165;
  uint uVar166;
  uint uVar167;
  float fVar168;
  uint uVar169;
  uint uVar170;
  float fVar171;
  vint4 ai_2;
  uint uVar172;
  uint uVar173;
  float fVar174;
  float fVar175;
  uint uVar176;
  uint uVar179;
  uint uVar180;
  undefined1 in_XMM10 [16];
  vint4 bi_2;
  uint uVar181;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar194 [16];
  float fVar198;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar199 [16];
  float fVar203;
  float fVar208;
  float fVar209;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar210;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar207;
  TravRayK<4,_false> *tray_00;
  vuint<4> *v_1;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  uint local_19d8;
  uint uStack_19d4;
  uint uStack_19d0;
  uint uStack_19cc;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined8 local_1858;
  undefined8 uStack_1850;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar29 = mm_lookupmask_ps._248_8_;
  uVar28 = mm_lookupmask_ps._240_8_;
  uVar27 = mm_lookupmask_ps._8_8_;
  uVar26 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar205._8_4_ = 0xffffffff;
    auVar205._0_8_ = 0xffffffffffffffff;
    auVar205._12_4_ = 0xffffffff;
    auVar103 = *(undefined1 (*) [16])(ray + 0x80);
    auVar60._0_12_ = ZEXT812(0);
    auVar60._12_4_ = 0;
    auVar72._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar103._0_4_);
    auVar72._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar103._4_4_);
    auVar72._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar103._8_4_);
    auVar72._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar103._12_4_);
    iVar39 = movmskps((int)context,auVar72);
    if (iVar39 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar131 = (float)DAT_01f80d30;
      fVar134 = DAT_01f80d30._4_4_;
      fVar137 = DAT_01f80d30._8_4_;
      fVar140 = DAT_01f80d30._12_4_;
      auVar54._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar134);
      auVar54._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar131);
      auVar54._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar137);
      auVar54._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar140);
      auVar144 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar54
                         );
      auVar73._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar134);
      auVar73._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar131);
      auVar73._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar137);
      auVar73._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar140);
      auVar73 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar73)
      ;
      auVar53._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar134);
      auVar53._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar131);
      auVar53._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar137);
      auVar53._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar140);
      auVar121 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar53
                         );
      auVar54 = rcpps(auVar53,auVar144);
      fVar131 = auVar54._0_4_;
      auVar145._0_4_ = auVar144._0_4_ * fVar131;
      fVar134 = auVar54._4_4_;
      auVar145._4_4_ = auVar144._4_4_ * fVar134;
      fVar137 = auVar54._8_4_;
      auVar145._8_4_ = auVar144._8_4_ * fVar137;
      fVar140 = auVar54._12_4_;
      auVar145._12_4_ = auVar144._12_4_ * fVar140;
      uVar153 = 1.0;
      uVar156 = 1.0;
      uVar159 = 1.0;
      uVar162 = 1.0;
      tray.rdir.field_0._0_4_ = (1.0 - auVar145._0_4_) * fVar131 + fVar131;
      tray.rdir.field_0._4_4_ = (1.0 - auVar145._4_4_) * fVar134 + fVar134;
      tray.rdir.field_0._8_4_ = (1.0 - auVar145._8_4_) * fVar137 + fVar137;
      tray.rdir.field_0._12_4_ = (1.0 - auVar145._12_4_) * fVar140 + fVar140;
      auVar54 = rcpps(auVar145,auVar73);
      fVar131 = auVar54._0_4_;
      fVar134 = auVar54._4_4_;
      fVar137 = auVar54._8_4_;
      fVar140 = auVar54._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar73._0_4_ * fVar131) * fVar131 + fVar131;
      tray.rdir.field_0._20_4_ = (1.0 - auVar73._4_4_ * fVar134) * fVar134 + fVar134;
      tray.rdir.field_0._24_4_ = (1.0 - auVar73._8_4_ * fVar137) * fVar137 + fVar137;
      tray.rdir.field_0._28_4_ = (1.0 - auVar73._12_4_ * fVar140) * fVar140 + fVar140;
      auVar54 = rcpps(auVar54,auVar121);
      fVar131 = auVar54._0_4_;
      fVar134 = auVar54._4_4_;
      fVar137 = auVar54._8_4_;
      fVar140 = auVar54._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar121._0_4_ * fVar131) * fVar131 + fVar131;
      tray.rdir.field_0._36_4_ = (1.0 - auVar121._4_4_ * fVar134) * fVar134 + fVar134;
      tray.rdir.field_0._40_4_ = (1.0 - auVar121._8_4_ * fVar137) * fVar137 + fVar137;
      tray.rdir.field_0._44_4_ = (1.0 - auVar121._12_4_ * fVar140) * fVar140 + fVar140;
      auVar121._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar121._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar121._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar121._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar121);
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar144._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar144._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar144._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar144._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar144);
      auVar54 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar60);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar54,auVar72);
      auVar103 = maxps(auVar103,auVar60);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar103,auVar72);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar205 ^ auVar72);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar43 = 3;
      }
      else {
        uVar43 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar48 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar41 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar32 = 0x21d2f80;
      aVar207 = _DAT_01f7a9f0;
LAB_002393f4:
      do {
        do {
          root.ptr = pNVar48[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0023a98c;
          pNVar48 = pNVar48 + -1;
          paVar41 = paVar41 + -1;
          aVar87.v = *(__m128 *)paVar41->v;
          auVar103._4_4_ = -(uint)(aVar87._4_4_ < tray.tfar.field_0.v[1]);
          auVar103._0_4_ = -(uint)(aVar87._0_4_ < tray.tfar.field_0.v[0]);
          auVar103._8_4_ = -(uint)(aVar87._8_4_ < tray.tfar.field_0.v[2]);
          auVar103._12_4_ = -(uint)(aVar87._12_4_ < tray.tfar.field_0.v[3]);
          uVar32 = movmskps(uVar32,auVar103);
        } while (uVar32 == 0);
        uVar35 = (ulong)(byte)uVar32;
        uVar34 = uVar32 & 0xff;
        if (uVar43 < (uint)POPCOUNT(uVar34)) {
LAB_00239434:
          vVar30.field_0 = terminated.field_0;
          do {
            uVar34 = (uint)root.ptr;
            fVar131 = aVar87.v[0];
            fVar134 = aVar87.v[1];
            fVar137 = aVar87.v[2];
            fVar140 = aVar87.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0023a98c;
              auVar57._4_4_ = -(uint)(fVar134 < tray.tfar.field_0.v[1]);
              auVar57._0_4_ = -(uint)(fVar131 < tray.tfar.field_0.v[0]);
              auVar57._8_4_ = -(uint)(fVar137 < tray.tfar.field_0.v[2]);
              auVar57._12_4_ = -(uint)(fVar140 < tray.tfar.field_0.v[3]);
              uVar32 = movmskps(uVar32,auVar57);
              if (uVar32 != 0) {
                uVar36 = (ulong)(uVar34 & 0xf) - 8;
                uVar35 = uVar36;
                if (uVar36 != 0) {
                  auVar122._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  auVar122._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                  auVar122._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                  uVar35 = 0;
                  uVar44 = uVar43;
                  do {
                    lVar40 = uVar35 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    uVar32 = movmskps((int)uVar44,auVar122);
                    uVar44 = (ulong)uVar32;
                    uVar49 = 0;
                    auVar103 = auVar122;
                    while( true ) {
                      uVar34 = *(uint *)(lVar40 + 0x50 + uVar49 * 4);
                      uVar37 = (ulong)uVar34;
                      if (uVar34 == 0xffffffff) break;
                      pGVar5 = (context->scene->geometries).items
                               [*(uint *)(lVar40 + 0x40 + uVar49 * 4)].ptr;
                      fVar131 = pGVar5->fnumTimeSegments;
                      fVar134 = (pGVar5->time_range).lower;
                      auVar88._0_4_ = (pGVar5->time_range).upper - fVar134;
                      auVar74._4_4_ = fVar134;
                      auVar74._0_4_ = fVar134;
                      auVar74._8_4_ = fVar134;
                      auVar74._12_4_ = fVar134;
                      auVar204._0_4_ = *(float *)(ray + 0x70) - fVar134;
                      auVar204._4_4_ = *(float *)(ray + 0x74) - fVar134;
                      auVar204._8_4_ = *(float *)(ray + 0x78) - fVar134;
                      auVar204._12_4_ = *(float *)(ray + 0x7c) - fVar134;
                      auVar88._4_4_ = auVar88._0_4_;
                      auVar88._8_4_ = auVar88._0_4_;
                      auVar88._12_4_ = auVar88._0_4_;
                      auVar205 = divps(auVar204,auVar88);
                      auVar206._0_4_ = auVar205._0_4_ * fVar131;
                      auVar206._4_4_ = auVar205._4_4_ * fVar131;
                      auVar206._8_4_ = auVar205._8_4_ * fVar131;
                      auVar206._12_4_ = auVar205._12_4_ * fVar131;
                      auVar205 = roundps(auVar74,auVar206,1);
                      auVar111._0_4_ = fVar131 + -1.0;
                      auVar111._4_4_ = auVar111._0_4_;
                      auVar111._8_4_ = auVar111._0_4_;
                      auVar111._12_4_ = auVar111._0_4_;
                      auVar205 = minps(auVar205,auVar111);
                      auVar205 = maxps(auVar205,_DAT_01f7aa10);
                      fVar131 = auVar206._0_4_ - auVar205._0_4_;
                      fVar134 = auVar206._4_4_ - auVar205._4_4_;
                      fVar137 = auVar206._8_4_ - auVar205._8_4_;
                      fVar140 = auVar206._12_4_ - auVar205._12_4_;
                      itime.field_0.i[0] = (int)auVar205._0_4_;
                      itime.field_0.i[1] = (int)auVar205._4_4_;
                      itime.field_0.i[2] = (int)auVar205._8_4_;
                      itime.field_0.i[3] = (int)auVar205._12_4_;
                      uVar37 = 0;
                      if (uVar44 != 0) {
                        for (; (uVar32 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      fVar68 = (float)itime.field_0.i[uVar37];
                      auVar75._0_4_ = -(uint)(fVar68 == (float)itime.field_0.i[0]);
                      auVar75._4_4_ = -(uint)(fVar68 == (float)itime.field_0.i[1]);
                      auVar75._8_4_ = -(uint)(fVar68 == (float)itime.field_0.i[2]);
                      auVar75._12_4_ = -(uint)(fVar68 == (float)itime.field_0.i[3]);
                      uVar166 = movmskps((int)valid_i,~auVar75 & auVar122);
                      valid_i = (vint<4> *)(ulong)uVar166;
                      if (uVar166 == 0) {
                        uVar37 = *(ulong *)(*(long *)&pGVar5[2].numPrimitives +
                                           (long)(int)fVar68 * 0x38);
                        lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 +
                                         (long)(int)fVar68 * 0x38);
                        uVar45 = (ulong)*(uint *)(lVar40 + uVar49 * 4);
                        uVar46 = (ulong)*(uint *)(lVar40 + 0x10 + uVar49 * 4);
                        pfVar2 = (float *)(uVar37 + uVar45 * 4);
                        fVar68 = *pfVar2;
                        fVar109 = pfVar2[1];
                        fVar141 = pfVar2[2];
                        pfVar2 = (float *)(lVar6 + uVar45 * 4);
                        fVar117 = *pfVar2;
                        fVar132 = pfVar2[1];
                        fVar149 = pfVar2[2];
                        fVar101 = 1.0 - fVar131;
                        fVar106 = 1.0 - fVar134;
                        fVar107 = 1.0 - fVar137;
                        fVar108 = 1.0 - fVar140;
                        fVar86 = fVar68 * fVar101 + fVar117 * fVar131;
                        fVar95 = fVar68 * fVar106 + fVar117 * fVar134;
                        fVar97 = fVar68 * fVar107 + fVar117 * fVar137;
                        fVar99 = fVar68 * fVar108 + fVar117 * fVar140;
                        fVar143 = fVar109 * fVar101 + fVar132 * fVar131;
                        fVar119 = fVar109 * fVar106 + fVar132 * fVar134;
                        fVar129 = fVar109 * fVar107 + fVar132 * fVar137;
                        fVar132 = fVar109 * fVar108 + fVar132 * fVar140;
                        fVar182 = fVar141 * fVar101 + fVar149 * fVar131;
                        fVar183 = fVar141 * fVar106 + fVar149 * fVar134;
                        fVar184 = fVar141 * fVar107 + fVar149 * fVar137;
                        fVar185 = fVar141 * fVar108 + fVar149 * fVar140;
                        pfVar2 = (float *)(uVar37 + uVar46 * 4);
                        fVar117 = *pfVar2;
                        fVar149 = pfVar2[1];
                        fVar150 = pfVar2[2];
                        pfVar2 = (float *)(lVar6 + uVar46 * 4);
                        fVar151 = *pfVar2;
                        fVar175 = pfVar2[1];
                        fVar51 = pfVar2[2];
                        fVar68 = fVar117 * fVar101 + fVar151 * fVar131;
                        fVar109 = fVar117 * fVar106 + fVar151 * fVar134;
                        fVar141 = fVar117 * fVar107 + fVar151 * fVar137;
                        fVar117 = fVar117 * fVar108 + fVar151 * fVar140;
                        fVar115 = fVar149 * fVar101 + fVar175 * fVar131;
                        fVar125 = fVar149 * fVar106 + fVar175 * fVar134;
                        fVar127 = fVar149 * fVar107 + fVar175 * fVar137;
                        fVar135 = fVar149 * fVar108 + fVar175 * fVar140;
                        fVar138 = fVar150 * fVar101 + fVar51 * fVar131;
                        fVar152 = fVar150 * fVar106 + fVar51 * fVar134;
                        fVar155 = fVar150 * fVar107 + fVar51 * fVar137;
                        fVar158 = fVar150 * fVar108 + fVar51 * fVar140;
                        uVar46 = (ulong)*(uint *)(lVar40 + 0x20 + uVar49 * 4);
                        pfVar2 = (float *)(uVar37 + uVar46 * 4);
                        fVar149 = *pfVar2;
                        fVar150 = pfVar2[1];
                        fVar151 = pfVar2[2];
                        pfVar2 = (float *)(lVar6 + uVar46 * 4);
                        fVar175 = *pfVar2;
                        fVar51 = pfVar2[1];
                        fVar62 = pfVar2[2];
                        local_1978 = fVar149 * fVar101 + fVar175 * fVar131;
                        fStack_1974 = fVar149 * fVar106 + fVar175 * fVar134;
                        fStack_1970 = fVar149 * fVar107 + fVar175 * fVar137;
                        fStack_196c = fVar149 * fVar108 + fVar175 * fVar140;
                        local_19f8 = fVar150 * fVar101 + fVar51 * fVar131;
                        fStack_19f4 = fVar150 * fVar106 + fVar51 * fVar134;
                        fStack_19f0 = fVar150 * fVar107 + fVar51 * fVar137;
                        fStack_19ec = fVar150 * fVar108 + fVar51 * fVar140;
                        fStack_19e4 = fVar151 * fVar106 + fVar62 * fVar134;
                        local_19e8 = fVar151 * fVar101 + fVar62 * fVar131;
                        fStack_19e0 = fVar151 * fVar107 + fVar62 * fVar137;
                        fStack_19dc = fVar151 * fVar108 + fVar62 * fVar140;
                        valid_i = (vint<4> *)(ulong)*(uint *)(lVar40 + 0x30 + uVar49 * 4);
                        pfVar2 = (float *)(lVar6 + (long)valid_i * 4);
                        fVar149 = *pfVar2;
                        fVar150 = pfVar2[1];
                        fVar151 = pfVar2[2];
                        pfVar2 = (float *)(uVar37 + (long)valid_i * 4);
                        fVar175 = *pfVar2;
                        fVar191 = pfVar2[1];
                        fVar102 = pfVar2[2];
                        fVar51 = fVar175 * fVar101 + fVar149 * fVar131;
                        fVar62 = fVar175 * fVar106 + fVar149 * fVar134;
                        fVar65 = fVar175 * fVar107 + fVar149 * fVar137;
                        fVar113 = fVar175 * fVar108 + fVar149 * fVar140;
                        fVar161 = fVar191 * fVar101 + fVar150 * fVar131;
                        fVar187 = fVar191 * fVar106 + fVar150 * fVar134;
                        fVar189 = fVar191 * fVar107 + fVar150 * fVar137;
                        fVar191 = fVar191 * fVar108 + fVar150 * fVar140;
                        fVar131 = fVar102 * fVar101 + fVar151 * fVar131;
                        fVar134 = fVar102 * fVar106 + fVar151 * fVar134;
                        fVar137 = fVar102 * fVar107 + fVar151 * fVar137;
                        fVar140 = fVar102 * fVar108 + fVar151 * fVar140;
                      }
                      else {
                        uVar33 = itime.field_0.i[0];
                        uVar96 = itime.field_0.i[1];
                        uVar98 = itime.field_0.i[2];
                        uVar100 = itime.field_0.i[3];
                        if (uVar44 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar42 = (ulong)*(uint *)(lVar40 + uVar49 * 4);
                          uVar45 = uVar44;
                          uVar46 = uVar37;
                          do {
                            lVar47 = (long)itime.field_0.i[uVar46] * 0x38;
                            valid_i = *(vint<4> **)(lVar6 + lVar47);
                            puVar3 = (undefined4 *)
                                     ((long)&((Intersectors *)valid_i)->ptr + uVar42 * 4);
                            uVar33 = puVar3[1];
                            uVar96 = puVar3[2];
                            auVar205 = *(undefined1 (*) [16])
                                        (*(long *)(lVar6 + 0x38 + lVar47) + uVar42 * 4);
                            *(undefined4 *)((long)&p0.field_0 + uVar46 * 4) = *puVar3;
                            *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x10) = uVar33;
                            *(undefined4 *)((long)&p0.field_0 + uVar46 * 4 + 0x20) = uVar96;
                            *(int *)((long)&p1.field_0 + uVar46 * 4) = auVar205._0_4_;
                            uVar38 = extractps(auVar205,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar46 * 4 + 0x10) = uVar38;
                            uVar38 = extractps(auVar205,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar46 * 4 + 0x20) = uVar38;
                            uVar45 = uVar45 ^ 1L << (uVar46 & 0x3f);
                            uVar46 = 0;
                            if (uVar45 != 0) {
                              for (; (uVar45 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                              }
                            }
                          } while (uVar45 != 0);
                          in_XMM10 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar33 = p1.field_0._0_4_;
                          uVar96 = p1.field_0._4_4_;
                          uVar98 = p1.field_0._8_4_;
                          uVar100 = p1.field_0._12_4_;
                        }
                        fVar149 = 1.0 - fVar131;
                        fVar150 = 1.0 - fVar134;
                        fVar151 = 1.0 - fVar137;
                        fVar175 = 1.0 - fVar140;
                        fVar143 = (float)p0.field_0._16_4_ * fVar149;
                        fVar119 = (float)p0.field_0._20_4_ * fVar150;
                        fVar129 = (float)p0.field_0._24_4_ * fVar151;
                        fVar132 = (float)p0.field_0._28_4_ * fVar175;
                        fVar182 = (float)p0.field_0._32_4_ * fVar149;
                        fVar183 = (float)p0.field_0._36_4_ * fVar150;
                        fVar184 = (float)p0.field_0._40_4_ * fVar151;
                        fVar185 = (float)p0.field_0._44_4_ * fVar175;
                        fVar51 = (float)p1.field_0._16_4_ * fVar131;
                        fVar62 = (float)p1.field_0._20_4_ * fVar134;
                        fVar65 = (float)p1.field_0._24_4_ * fVar137;
                        fVar113 = (float)p1.field_0._28_4_ * fVar140;
                        fVar68 = (float)p1.field_0._32_4_ * fVar131;
                        fVar109 = (float)p1.field_0._36_4_ * fVar134;
                        fVar141 = (float)p1.field_0._40_4_ * fVar137;
                        fVar117 = (float)p1.field_0._44_4_ * fVar140;
                        uVar52 = fVar68;
                        uVar64 = fVar109;
                        uVar67 = fVar141;
                        uVar70 = fVar117;
                        if (uVar44 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar42 = (ulong)*(uint *)(lVar40 + 0x10 + uVar49 * 4);
                          uVar45 = uVar44;
                          uVar46 = uVar37;
                          do {
                            lVar47 = (long)itime.field_0.i[uVar46] * 0x38;
                            valid_i = *(vint<4> **)(lVar6 + lVar47);
                            auVar205 = *(undefined1 (*) [16])
                                        ((long)&((Intersectors *)valid_i)->ptr + uVar42 * 4);
                            auVar60 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 + lVar47) + uVar42 * 4);
                            uVar153 = auVar60._0_4_;
                            uVar156 = auVar60._4_4_;
                            uVar159 = auVar60._8_4_;
                            uVar162 = auVar60._12_4_;
                            *(int *)((long)&p0.field_0 + uVar46 * 4) = auVar205._0_4_;
                            uVar38 = extractps(auVar205,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar46 * 4 + 0x10) = uVar38;
                            uVar38 = extractps(auVar205,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar46 * 4 + 0x20) = uVar38;
                            *(undefined4 *)((long)&p1.field_0 + uVar46 * 4) = uVar153;
                            uVar38 = extractps(auVar60,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar46 * 4 + 0x10) = uVar38;
                            uVar38 = extractps(auVar60,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar46 * 4 + 0x20) = uVar38;
                            uVar45 = uVar45 ^ 1L << (uVar46 & 0x3f);
                            uVar46 = 0;
                            if (uVar45 != 0) {
                              for (; (uVar45 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                              }
                            }
                          } while (uVar45 != 0);
                          local_1858 = p0.field_0._0_8_;
                          uStack_1850 = p0.field_0._8_8_;
                          uVar52 = p1.field_0._0_4_;
                          uVar64 = p1.field_0._4_4_;
                          uVar67 = p1.field_0._8_4_;
                          uVar70 = p1.field_0._12_4_;
                        }
                        fVar115 = (float)p0.field_0._16_4_ * fVar149;
                        fVar125 = (float)p0.field_0._20_4_ * fVar150;
                        fVar127 = (float)p0.field_0._24_4_ * fVar151;
                        fVar135 = (float)p0.field_0._28_4_ * fVar175;
                        fVar138 = (float)p0.field_0._32_4_ * fVar149;
                        fVar152 = (float)p0.field_0._36_4_ * fVar150;
                        fVar155 = (float)p0.field_0._40_4_ * fVar151;
                        fVar158 = (float)p0.field_0._44_4_ * fVar175;
                        fVar161 = (float)p1.field_0._16_4_ * fVar131;
                        fVar187 = (float)p1.field_0._20_4_ * fVar134;
                        fVar189 = (float)p1.field_0._24_4_ * fVar137;
                        fVar191 = (float)p1.field_0._28_4_ * fVar140;
                        fVar102 = (float)p1.field_0._32_4_ * fVar131;
                        fVar101 = (float)p1.field_0._36_4_ * fVar134;
                        fVar106 = (float)p1.field_0._40_4_ * fVar137;
                        fVar107 = (float)p1.field_0._44_4_ * fVar140;
                        auVar205 = auVar122;
                        if (uVar44 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar42 = (ulong)*(uint *)(lVar40 + 0x20 + uVar49 * 4);
                          uVar45 = uVar44;
                          uVar46 = uVar37;
                          do {
                            lVar47 = (long)itime.field_0.i[uVar46] * 0x38;
                            valid_i = *(vint<4> **)(lVar6 + lVar47);
                            auVar205 = *(undefined1 (*) [16])
                                        ((long)&((Intersectors *)valid_i)->ptr + uVar42 * 4);
                            auVar60 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + 0x38 + lVar47) + uVar42 * 4);
                            *(int *)((long)&p0.field_0 + uVar46 * 4) = auVar205._0_4_;
                            uVar38 = extractps(auVar205,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar46 * 4 + 0x10) = uVar38;
                            uVar38 = extractps(auVar205,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar46 * 4 + 0x20) = uVar38;
                            *(int *)((long)&p1.field_0 + uVar46 * 4) = auVar60._0_4_;
                            uVar38 = extractps(auVar60,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar46 * 4 + 0x10) = uVar38;
                            uVar38 = extractps(auVar60,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar46 * 4 + 0x20) = uVar38;
                            uVar45 = uVar45 ^ 1L << (uVar46 & 0x3f);
                            uVar46 = 0;
                            if (uVar45 != 0) {
                              for (; (uVar45 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                              }
                            }
                          } while (uVar45 != 0);
                          local_1978 = (float)p1.field_0._0_8_;
                          fStack_1974 = (float)((ulong)p1.field_0._0_8_ >> 0x20);
                          fStack_1970 = (float)p1.field_0._8_8_;
                          fStack_196c = (float)((ulong)p1.field_0._8_8_ >> 0x20);
                          auVar205 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar153 = fVar51;
                          uVar156 = fVar62;
                          uVar159 = fVar65;
                          uVar162 = fVar113;
                        }
                        local_19f8 = (float)p0.field_0._16_4_ * fVar149;
                        fStack_19f4 = (float)p0.field_0._20_4_ * fVar150;
                        fStack_19f0 = (float)p0.field_0._24_4_ * fVar151;
                        fStack_19ec = (float)p0.field_0._28_4_ * fVar175;
                        fVar108 = (float)p0.field_0._32_4_ * fVar149;
                        fVar63 = (float)p0.field_0._36_4_ * fVar150;
                        fVar66 = (float)p0.field_0._40_4_ * fVar151;
                        fVar69 = (float)p0.field_0._44_4_ * fVar175;
                        fVar71 = (float)p1.field_0._16_4_ * fVar131;
                        fVar83 = (float)p1.field_0._20_4_ * fVar134;
                        fVar84 = (float)p1.field_0._24_4_ * fVar137;
                        fVar85 = (float)p1.field_0._28_4_ * fVar140;
                        fVar110 = (float)p1.field_0._32_4_ * fVar131;
                        fVar114 = (float)p1.field_0._36_4_ * fVar134;
                        fVar116 = (float)p1.field_0._40_4_ * fVar137;
                        fVar118 = (float)p1.field_0._44_4_ * fVar140;
                        auVar60 = auVar103;
                        if (uVar44 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          valid_i = (vint<4> *)(lVar6 + 0x38);
                          uVar45 = (ulong)*(uint *)(lVar40 + 0x30 + uVar49 * 4);
                          uVar46 = uVar44;
                          do {
                            auVar60 = *(undefined1 (*) [16])
                                       (*(long *)(lVar6 + (long)itime.field_0.i[uVar37] * 0x38) +
                                       uVar45 * 4);
                            auVar54 = *(undefined1 (*) [16])
                                       ((long)&((&((Intersectors *)valid_i)->ptr)
                                                [(long)itime.field_0.i[uVar37] * 7]->super_RefCount)
                                               ._vptr_RefCount + uVar45 * 4);
                            *(int *)((long)&p0.field_0 + uVar37 * 4) = auVar60._0_4_;
                            uVar38 = extractps(auVar60,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar37 * 4 + 0x10) = uVar38;
                            uVar38 = extractps(auVar60,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar37 * 4 + 0x20) = uVar38;
                            *(int *)((long)&p1.field_0 + uVar37 * 4) = auVar54._0_4_;
                            uVar38 = extractps(auVar54,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar37 * 4 + 0x10) = uVar38;
                            uVar38 = extractps(auVar54,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar37 * 4 + 0x20) = uVar38;
                            uVar46 = uVar46 ^ 1L << (uVar37 & 0x3f);
                            uVar37 = 0;
                            if (uVar46 != 0) {
                              for (; (uVar46 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                              }
                            }
                          } while (uVar46 != 0);
                          uVar153 = p1.field_0._0_4_;
                          uVar156 = p1.field_0._4_4_;
                          uVar159 = p1.field_0._8_4_;
                          uVar162 = p1.field_0._12_4_;
                          auVar60 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        fVar86 = (float)uVar33 * fVar131 + in_XMM10._0_4_ * fVar149;
                        fVar95 = (float)uVar96 * fVar134 + in_XMM10._4_4_ * fVar150;
                        fVar97 = (float)uVar98 * fVar137 + in_XMM10._8_4_ * fVar151;
                        fVar99 = (float)uVar100 * fVar140 + in_XMM10._12_4_ * fVar175;
                        fVar143 = fVar143 + fVar51;
                        fVar119 = fVar119 + fVar62;
                        fVar129 = fVar129 + fVar65;
                        fVar132 = fVar132 + fVar113;
                        fVar182 = fVar182 + fVar68;
                        fVar183 = fVar183 + fVar109;
                        fVar184 = fVar184 + fVar141;
                        fVar185 = fVar185 + fVar117;
                        fVar68 = (float)uVar52 * fVar131 + (float)local_1858 * fVar149;
                        fVar109 = (float)uVar64 * fVar134 + local_1858._4_4_ * fVar150;
                        fVar141 = (float)uVar67 * fVar137 + (float)uStack_1850 * fVar151;
                        fVar117 = (float)uVar70 * fVar140 + uStack_1850._4_4_ * fVar175;
                        fVar115 = fVar115 + fVar161;
                        fVar125 = fVar125 + fVar187;
                        fVar127 = fVar127 + fVar189;
                        fVar135 = fVar135 + fVar191;
                        fVar138 = fVar138 + fVar102;
                        fVar152 = fVar152 + fVar101;
                        fVar155 = fVar155 + fVar106;
                        fVar158 = fVar158 + fVar107;
                        local_1978 = local_1978 * fVar131 + auVar205._0_4_ * fVar149;
                        fStack_1974 = fStack_1974 * fVar134 + auVar205._4_4_ * fVar150;
                        fStack_1970 = fStack_1970 * fVar137 + auVar205._8_4_ * fVar151;
                        fStack_196c = fStack_196c * fVar140 + auVar205._12_4_ * fVar175;
                        local_19f8 = local_19f8 + fVar71;
                        fStack_19f4 = fStack_19f4 + fVar83;
                        fStack_19f0 = fStack_19f0 + fVar84;
                        fStack_19ec = fStack_19ec + fVar85;
                        fStack_19e4 = fVar63 + fVar114;
                        local_19e8 = fVar108 + fVar110;
                        fStack_19e0 = fVar66 + fVar116;
                        fStack_19dc = fVar69 + fVar118;
                        fVar51 = (float)uVar153 * fVar131 + auVar60._0_4_ * fVar149;
                        fVar62 = (float)uVar156 * fVar134 + auVar60._4_4_ * fVar150;
                        fVar65 = (float)uVar159 * fVar137 + auVar60._8_4_ * fVar151;
                        fVar113 = (float)uVar162 * fVar140 + auVar60._12_4_ * fVar175;
                        fVar161 = (float)p1.field_0._16_4_ * fVar131 +
                                  (float)p0.field_0._16_4_ * fVar149;
                        fVar187 = (float)p1.field_0._20_4_ * fVar134 +
                                  (float)p0.field_0._20_4_ * fVar150;
                        fVar189 = (float)p1.field_0._24_4_ * fVar137 +
                                  (float)p0.field_0._24_4_ * fVar151;
                        fVar191 = (float)p1.field_0._28_4_ * fVar140 +
                                  (float)p0.field_0._28_4_ * fVar175;
                        fVar131 = fVar131 * (float)p1.field_0._32_4_ +
                                  fVar149 * (float)p0.field_0._32_4_;
                        fVar134 = fVar134 * (float)p1.field_0._36_4_ +
                                  fVar150 * (float)p0.field_0._36_4_;
                        fVar137 = fVar137 * (float)p1.field_0._40_4_ +
                                  fVar151 * (float)p0.field_0._40_4_;
                        fVar140 = fVar140 * (float)p1.field_0._44_4_ +
                                  fVar175 * (float)p0.field_0._44_4_;
                      }
                      fVar165 = fVar86 - fVar68;
                      fVar168 = fVar95 - fVar109;
                      fVar171 = fVar97 - fVar141;
                      fVar174 = fVar99 - fVar117;
                      fVar108 = fVar143 - fVar115;
                      fVar63 = fVar119 - fVar125;
                      fVar66 = fVar129 - fVar127;
                      fVar69 = fVar132 - fVar135;
                      local_1858 = CONCAT44(fVar152,fVar138);
                      uStack_1850 = CONCAT44(fVar158,fVar155);
                      fVar71 = fVar182 - fVar138;
                      fVar83 = fVar183 - fVar152;
                      fVar84 = fVar184 - fVar155;
                      fVar85 = fVar185 - fVar158;
                      fVar110 = fVar51 - fVar86;
                      fVar114 = fVar62 - fVar95;
                      fVar116 = fVar65 - fVar97;
                      fVar118 = fVar113 - fVar99;
                      fVar186 = fVar161 - fVar143;
                      fVar188 = fVar187 - fVar119;
                      fVar190 = fVar189 - fVar129;
                      fVar192 = fVar191 - fVar132;
                      fVar154 = fVar131 - fVar182;
                      fVar157 = fVar134 - fVar183;
                      fVar160 = fVar137 - fVar184;
                      fVar163 = fVar140 - fVar185;
                      fVar120 = fVar186 * fVar71 - fVar108 * fVar154;
                      fVar126 = fVar188 * fVar83 - fVar63 * fVar157;
                      fVar128 = fVar190 * fVar84 - fVar66 * fVar160;
                      fVar130 = fVar192 * fVar85 - fVar69 * fVar163;
                      fVar133 = fVar165 * fVar154 - fVar110 * fVar71;
                      fVar136 = fVar168 * fVar157 - fVar114 * fVar83;
                      fVar139 = fVar171 * fVar160 - fVar116 * fVar84;
                      fVar142 = fVar174 * fVar163 - fVar118 * fVar85;
                      vVar146.field_0._0_4_ = fVar110 * fVar108 - fVar165 * fVar186;
                      vVar146.field_0._4_4_ = fVar114 * fVar63 - fVar168 * fVar188;
                      vVar146.field_0._8_4_ = fVar116 * fVar66 - fVar171 * fVar190;
                      vVar146.field_0._12_4_ = fVar118 * fVar69 - fVar174 * fVar192;
                      fVar86 = fVar86 - *(float *)ray;
                      fVar95 = fVar95 - *(float *)(ray + 4);
                      fVar97 = fVar97 - *(float *)(ray + 8);
                      fVar99 = fVar99 - *(float *)(ray + 0xc);
                      auVar177._0_4_ = fVar143 - *(float *)(ray + 0x10);
                      auVar177._4_4_ = fVar119 - *(float *)(ray + 0x14);
                      auVar177._8_4_ = fVar129 - *(float *)(ray + 0x18);
                      auVar177._12_4_ = fVar132 - *(float *)(ray + 0x1c);
                      fVar182 = fVar182 - *(float *)(ray + 0x20);
                      fVar183 = fVar183 - *(float *)(ray + 0x24);
                      fVar184 = fVar184 - *(float *)(ray + 0x28);
                      fVar185 = fVar185 - *(float *)(ray + 0x2c);
                      fVar143 = *(float *)(ray + 0x40);
                      fVar119 = *(float *)(ray + 0x44);
                      fVar129 = *(float *)(ray + 0x48);
                      fVar132 = *(float *)(ray + 0x4c);
                      fVar149 = *(float *)(ray + 0x50);
                      fVar150 = *(float *)(ray + 0x54);
                      fVar151 = *(float *)(ray + 0x58);
                      fVar175 = *(float *)(ray + 0x5c);
                      fVar102 = *(float *)(ray + 0x60);
                      fVar101 = *(float *)(ray + 100);
                      fVar106 = *(float *)(ray + 0x68);
                      fVar107 = *(float *)(ray + 0x6c);
                      fVar193 = auVar177._0_4_ * fVar102 - fVar182 * fVar149;
                      fVar195 = auVar177._4_4_ * fVar101 - fVar183 * fVar150;
                      fVar196 = auVar177._8_4_ * fVar106 - fVar184 * fVar151;
                      fVar197 = auVar177._12_4_ * fVar107 - fVar185 * fVar175;
                      fVar198 = fVar182 * fVar143 - fVar86 * fVar102;
                      fVar200 = fVar183 * fVar119 - fVar95 * fVar101;
                      fVar201 = fVar184 * fVar129 - fVar97 * fVar106;
                      fVar202 = fVar185 * fVar132 - fVar99 * fVar107;
                      fVar203 = fVar86 * fVar149 - auVar177._0_4_ * fVar143;
                      fVar208 = fVar95 * fVar150 - auVar177._4_4_ * fVar119;
                      fVar209 = fVar97 * fVar151 - auVar177._8_4_ * fVar129;
                      fVar210 = fVar99 * fVar175 - auVar177._12_4_ * fVar132;
                      fVar149 = fVar143 * fVar120 +
                                fVar149 * fVar133 + fVar102 * vVar146.field_0._0_4_;
                      fVar150 = fVar119 * fVar126 +
                                fVar150 * fVar136 + fVar101 * vVar146.field_0._4_4_;
                      fVar151 = fVar129 * fVar128 +
                                fVar151 * fVar139 + fVar106 * vVar146.field_0._8_4_;
                      fVar175 = fVar132 * fVar130 +
                                fVar175 * fVar142 + fVar107 * vVar146.field_0._12_4_;
                      uVar153 = (uint)fVar149 & 0x80000000;
                      uVar156 = (uint)fVar150 & 0x80000000;
                      uVar159 = (uint)fVar151 & 0x80000000;
                      uVar162 = (uint)fVar175 & 0x80000000;
                      fVar143 = (float)((uint)(fVar110 * fVar193 +
                                              fVar186 * fVar198 + fVar154 * fVar203) ^ uVar153);
                      fVar119 = (float)((uint)(fVar114 * fVar195 +
                                              fVar188 * fVar200 + fVar157 * fVar208) ^ uVar156);
                      fVar129 = (float)((uint)(fVar116 * fVar196 +
                                              fVar190 * fVar201 + fVar160 * fVar209) ^ uVar159);
                      fVar132 = (float)((uint)(fVar118 * fVar197 +
                                              fVar192 * fVar202 + fVar163 * fVar210) ^ uVar162);
                      local_19d8 = auVar103._0_4_;
                      uStack_19d4 = auVar103._4_4_;
                      uStack_19d0 = auVar103._8_4_;
                      uStack_19cc = auVar103._12_4_;
                      local_19d8 = -(uint)(0.0 <= fVar143) & local_19d8;
                      uStack_19d4 = -(uint)(0.0 <= fVar119) & uStack_19d4;
                      uStack_19d0 = -(uint)(0.0 <= fVar129) & uStack_19d0;
                      uStack_19cc = -(uint)(0.0 <= fVar132) & uStack_19cc;
                      auVar23._4_4_ = uStack_19d4;
                      auVar23._0_4_ = local_19d8;
                      auVar23._8_4_ = uStack_19d0;
                      auVar23._12_4_ = uStack_19cc;
                      iVar39 = movmskps((int)uVar37,auVar23);
                      in_XMM10 = auVar177;
                      if (iVar39 != 0) {
                        in_XMM10._0_4_ = fVar108 * fVar198 + fVar71 * fVar203;
                        in_XMM10._4_4_ = fVar63 * fVar200 + fVar83 * fVar208;
                        in_XMM10._8_4_ = fVar66 * fVar201 + fVar84 * fVar209;
                        in_XMM10._12_4_ = fVar69 * fVar202 + fVar85 * fVar210;
                        fVar102 = (float)((uint)(fVar165 * fVar193 + in_XMM10._0_4_) ^ uVar153);
                        fVar101 = (float)((uint)(fVar168 * fVar195 + in_XMM10._4_4_) ^ uVar156);
                        fVar106 = (float)((uint)(fVar171 * fVar196 + in_XMM10._8_4_) ^ uVar159);
                        fVar107 = (float)((uint)(fVar174 * fVar197 + in_XMM10._12_4_) ^ uVar162);
                        auVar194._0_4_ = -(uint)(0.0 <= fVar102) & local_19d8;
                        auVar194._4_4_ = -(uint)(0.0 <= fVar101) & uStack_19d4;
                        auVar194._8_4_ = -(uint)(0.0 <= fVar106) & uStack_19d0;
                        auVar194._12_4_ = -(uint)(0.0 <= fVar107) & uStack_19cc;
                        iVar39 = movmskps(iVar39,auVar194);
                        if (iVar39 != 0) {
                          fVar108 = ABS(fVar149);
                          fVar63 = ABS(fVar150);
                          in_XMM10._0_8_ = CONCAT44(fVar150,fVar149) & 0x7fffffff7fffffff;
                          in_XMM10._8_4_ = ABS(fVar151);
                          in_XMM10._12_4_ = ABS(fVar175);
                          uVar166 = -(uint)(fVar102 <= fVar108 - fVar143) & auVar194._0_4_;
                          uVar169 = -(uint)(fVar101 <= fVar63 - fVar119) & auVar194._4_4_;
                          uVar172 = -(uint)(fVar106 <= in_XMM10._8_4_ - fVar129) & auVar194._8_4_;
                          uVar176 = -(uint)(fVar107 <= in_XMM10._12_4_ - fVar132) & auVar194._12_4_;
                          auVar22._4_4_ = uVar169;
                          auVar22._0_4_ = uVar166;
                          auVar22._8_4_ = uVar172;
                          auVar22._12_4_ = uVar176;
                          iVar39 = movmskps(iVar39,auVar22);
                          if (iVar39 != 0) {
                            uVar153 = uVar153 ^ (uint)(fVar86 * fVar120 +
                                                      auVar177._0_4_ * fVar133 +
                                                      fVar182 * vVar146.field_0._0_4_);
                            uVar156 = uVar156 ^ (uint)(fVar95 * fVar126 +
                                                      auVar177._4_4_ * fVar136 +
                                                      fVar183 * vVar146.field_0._4_4_);
                            uVar159 = uVar159 ^ (uint)(fVar97 * fVar128 +
                                                      auVar177._8_4_ * fVar139 +
                                                      fVar184 * vVar146.field_0._8_4_);
                            uVar162 = uVar162 ^ (uint)(fVar99 * fVar130 +
                                                      auVar177._12_4_ * fVar142 +
                                                      fVar185 * vVar146.field_0._12_4_);
                            pRVar1 = ray + 0x80;
                            auVar205 = *(undefined1 (*) [16])pRVar1;
                            auVar59._0_4_ =
                                 -(uint)((float)uVar153 <= fVar108 * *(float *)pRVar1 &&
                                        *(float *)(ray + 0x30) * fVar108 < (float)uVar153) & uVar166
                            ;
                            auVar59._4_4_ =
                                 -(uint)((float)uVar156 <= fVar63 * *(float *)(ray + 0x84) &&
                                        *(float *)(ray + 0x34) * fVar63 < (float)uVar156) & uVar169;
                            auVar59._8_4_ =
                                 -(uint)((float)uVar159 <= in_XMM10._8_4_ * *(float *)(ray + 0x88)
                                        && *(float *)(ray + 0x38) * in_XMM10._8_4_ < (float)uVar159)
                                 & uVar172;
                            auVar59._12_4_ =
                                 -(uint)((float)uVar162 <= in_XMM10._12_4_ * *(float *)(ray + 0x8c)
                                        && *(float *)(ray + 0x3c) * in_XMM10._12_4_ < (float)uVar162
                                        ) & uVar176;
                            iVar39 = movmskps(iVar39,auVar59);
                            if (iVar39 != 0) {
                              uVar166 = -(uint)(fVar149 != 0.0) & auVar59._0_4_;
                              uVar169 = -(uint)(fVar150 != 0.0) & auVar59._4_4_;
                              uVar172 = -(uint)(fVar151 != 0.0) & auVar59._8_4_;
                              uVar176 = -(uint)(fVar175 != 0.0) & auVar59._12_4_;
                              auVar17._4_4_ = uVar169;
                              auVar17._0_4_ = uVar166;
                              auVar17._8_4_ = uVar172;
                              auVar17._12_4_ = uVar176;
                              iVar39 = movmskps(iVar39,auVar17);
                              if (iVar39 != 0) {
                                uVar179 = pGVar5->mask;
                                auVar79._0_4_ = -(uint)((uVar179 & *(uint *)(ray + 0x90)) == 0);
                                auVar79._4_4_ = -(uint)((uVar179 & *(uint *)(ray + 0x94)) == 0);
                                auVar79._8_4_ = -(uint)((uVar179 & *(uint *)(ray + 0x98)) == 0);
                                auVar79._12_4_ = -(uint)((uVar179 & *(uint *)(ray + 0x9c)) == 0);
                                auVar18._4_4_ = uVar169;
                                auVar18._0_4_ = uVar166;
                                auVar18._8_4_ = uVar172;
                                auVar18._12_4_ = uVar176;
                                aVar80 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         (~auVar79 & auVar18);
                                iVar39 = movmskps(iVar39,(undefined1  [16])aVar80);
                                if (iVar39 != 0) {
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar60 = rcpps(ZEXT416(uVar179),in_XMM10);
                                    fVar149 = auVar60._0_4_;
                                    fVar150 = auVar60._4_4_;
                                    fVar151 = auVar60._8_4_;
                                    fVar175 = auVar60._12_4_;
                                    fVar182 = (float)DAT_01f7ba10;
                                    fVar183 = DAT_01f7ba10._4_4_;
                                    fVar184 = DAT_01f7ba10._8_4_;
                                    fVar185 = DAT_01f7ba10._12_4_;
                                    fVar149 = (fVar182 - fVar108 * fVar149) * fVar149 + fVar149;
                                    fVar150 = (fVar183 - fVar63 * fVar150) * fVar150 + fVar150;
                                    fVar151 = (fVar184 - in_XMM10._8_4_ * fVar151) * fVar151 +
                                              fVar151;
                                    fVar175 = (fVar185 - in_XMM10._12_4_ * fVar175) * fVar175 +
                                              fVar175;
                                    auVar112._0_4_ = fVar143 * fVar149;
                                    auVar112._4_4_ = fVar119 * fVar150;
                                    auVar112._8_4_ = fVar129 * fVar151;
                                    auVar112._12_4_ = fVar132 * fVar175;
                                    auVar60 = minps(auVar112,_DAT_01f7ba10);
                                    auVar178._0_4_ = fVar102 * fVar149;
                                    auVar178._4_4_ = fVar101 * fVar150;
                                    auVar178._8_4_ = fVar106 * fVar151;
                                    auVar178._12_4_ = fVar107 * fVar175;
                                    auVar54 = minps(auVar178,_DAT_01f7ba10);
                                    auVar105._0_4_ = fVar182 - auVar60._0_4_;
                                    auVar105._4_4_ = fVar183 - auVar60._4_4_;
                                    auVar105._8_4_ = fVar184 - auVar60._8_4_;
                                    auVar105._12_4_ = fVar185 - auVar60._12_4_;
                                    auVar25._8_8_ = uVar27;
                                    auVar25._0_8_ = uVar26;
                                    blendvps(auVar60,auVar105,auVar25);
                                    auVar19._4_4_ = fVar183 - auVar54._4_4_;
                                    auVar19._0_4_ = fVar182 - auVar54._0_4_;
                                    auVar19._8_4_ = fVar184 - auVar54._8_4_;
                                    auVar19._12_4_ = fVar185 - auVar54._12_4_;
                                    in_XMM10 = blendvps(auVar54,auVar19,auVar25);
                                    p0.field_0._4_4_ = fVar126;
                                    p0.field_0._0_4_ = fVar120;
                                    p0.field_0._8_4_ = fVar128;
                                    p0.field_0._12_4_ = fVar130;
                                    p0.field_0._20_4_ = fVar136;
                                    p0.field_0._16_4_ = fVar133;
                                    p0.field_0._24_4_ = fVar139;
                                    p0.field_0._28_4_ = fVar142;
                                    p0.field_0.field_0.z.field_0 =
                                         (vfloat_impl<4>)(vfloat_impl<4>)vVar146.field_0;
                                    auVar91._0_4_ = fVar149 * (float)uVar153;
                                    auVar91._4_4_ = fVar150 * (float)uVar156;
                                    auVar91._8_4_ = fVar151 * (float)uVar159;
                                    auVar91._12_4_ = fVar175 * (float)uVar162;
                                    auVar60 = blendvps(*(undefined1 (*) [16])pRVar1,auVar91,
                                                       (undefined1  [16])aVar80);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar60;
                                    itime.field_0 = aVar80;
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar5->userPtr;
                                    p1.field_0._16_8_ = context->user;
                                    p1.field_0._24_8_ = ray;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._40_4_ = 4;
                                    uVar38 = pGVar5->occlusionFilterN;
                                    if ((RTCFilterFunctionN)uVar38 != (RTCFilterFunctionN)0x0) {
                                      valid_i = (vint<4> *)&p1;
                                      uVar38 = (*(code *)uVar38)((RTCFilterFunctionNArguments *)
                                                                 valid_i);
                                    }
                                    if (itime.field_0 ==
                                        (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                      auVar92._8_4_ = 0xffffffff;
                                      auVar92._0_8_ = 0xffffffffffffffff;
                                      auVar92._12_4_ = 0xffffffff;
                                      auVar92 = auVar92 ^ _DAT_01f7ae20;
                                    }
                                    else {
                                      p_Var8 = context->args->filter;
                                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                        valid_i = (vint<4> *)&p1;
                                        (*p_Var8)((RTCFilterFunctionNArguments *)valid_i);
                                      }
                                      auVar82._0_4_ = -(uint)(itime.field_0._0_4_ == 0);
                                      auVar82._4_4_ = -(uint)(itime.field_0._4_4_ == 0);
                                      auVar82._8_4_ = -(uint)(itime.field_0._8_4_ == 0);
                                      auVar82._12_4_ = -(uint)(itime.field_0._12_4_ == 0);
                                      auVar92 = auVar82 ^ _DAT_01f7ae20;
                                      auVar60 = blendvps(_DAT_01f7aa00,
                                                         *(undefined1 (*) [16])
                                                          (p1.field_0._24_8_ + 0x80),auVar82);
                                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar60;
                                      uVar38 = p1.field_0._24_8_;
                                    }
                                    uVar34 = (uint)uVar38;
                                    auVar94._0_4_ = auVar92._0_4_ << 0x1f;
                                    auVar94._4_4_ = auVar92._4_4_ << 0x1f;
                                    auVar94._8_4_ = auVar92._8_4_ << 0x1f;
                                    auVar94._12_4_ = auVar92._12_4_ << 0x1f;
                                    aVar80._0_4_ = auVar94._0_4_ >> 0x1f;
                                    aVar80._4_4_ = auVar94._4_4_ >> 0x1f;
                                    aVar80._8_4_ = auVar94._8_4_ >> 0x1f;
                                    aVar80._12_4_ = auVar94._12_4_ >> 0x1f;
                                    auVar205 = blendvps(auVar205,*(undefined1 (*) [16])(ray + 0x80),
                                                        auVar94);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar205;
                                  }
                                  auVar103 = ~(undefined1  [16])aVar80 & auVar103;
                                }
                              }
                            }
                          }
                        }
                      }
                      uVar34 = movmskps(uVar34,auVar103);
                      uVar37 = (ulong)uVar34;
                      fVar143 = local_19e8;
                      fVar119 = local_19e8._4_4_;
                      fVar129 = local_19e8._8_4_;
                      fVar132 = local_19e8._12_4_;
                      aVar207 = _DAT_01f7a9f0;
                      if (uVar34 == 0) break;
                      fVar51 = local_1978 - fVar51;
                      fVar62 = fStack_1974 - fVar62;
                      fVar65 = fStack_1970 - fVar65;
                      fVar113 = fStack_196c - fVar113;
                      fVar161 = local_19f8 - fVar161;
                      fVar187 = fStack_19f4 - fVar187;
                      fVar189 = fStack_19f0 - fVar189;
                      fVar191 = fStack_19ec - fVar191;
                      fVar131 = fVar143 - fVar131;
                      fVar134 = fVar119 - fVar134;
                      fVar137 = fVar129 - fVar137;
                      fVar140 = fVar132 - fVar140;
                      fVar68 = fVar68 - local_1978;
                      fVar109 = fVar109 - fStack_1974;
                      fVar141 = fVar141 - fStack_1970;
                      fVar117 = fVar117 - fStack_196c;
                      fVar115 = fVar115 - local_19f8;
                      fVar125 = fVar125 - fStack_19f4;
                      fVar127 = fVar127 - fStack_19f0;
                      fVar135 = fVar135 - fStack_19ec;
                      fVar138 = fVar138 - fVar143;
                      fVar152 = fVar152 - fVar119;
                      fVar155 = fVar155 - fVar129;
                      fVar158 = fVar158 - fVar132;
                      fVar108 = fVar131 * fVar115 - fVar161 * fVar138;
                      fVar63 = fVar134 * fVar125 - fVar187 * fVar152;
                      vVar89.field_0.v[1] = fVar63;
                      vVar89.field_0.v[0] = fVar108;
                      fVar66 = fVar137 * fVar127 - fVar189 * fVar155;
                      fVar69 = fVar140 * fVar135 - fVar191 * fVar158;
                      fVar86 = fVar51 * fVar138 - fVar131 * fVar68;
                      fVar95 = fVar62 * fVar152 - fVar134 * fVar109;
                      vVar21.field_0.v[1] = fVar95;
                      vVar21.field_0.v[0] = fVar86;
                      fVar97 = fVar65 * fVar155 - fVar137 * fVar141;
                      fVar99 = fVar113 * fVar158 - fVar140 * fVar117;
                      fVar110 = fVar161 * fVar68 - fVar51 * fVar115;
                      fVar114 = fVar187 * fVar109 - fVar62 * fVar125;
                      fVar116 = fVar189 * fVar141 - fVar65 * fVar127;
                      fVar118 = fVar191 * fVar117 - fVar113 * fVar135;
                      fVar71 = local_1978 - *(float *)ray;
                      fVar83 = fStack_1974 - *(float *)(ray + 4);
                      fVar84 = fStack_1970 - *(float *)(ray + 8);
                      fVar85 = fStack_196c - *(float *)(ray + 0xc);
                      local_19f8 = local_19f8 - *(float *)(ray + 0x10);
                      fStack_19f4 = fStack_19f4 - *(float *)(ray + 0x14);
                      fStack_19f0 = fStack_19f0 - *(float *)(ray + 0x18);
                      fStack_19ec = fStack_19ec - *(float *)(ray + 0x1c);
                      fVar143 = fVar143 - *(float *)(ray + 0x20);
                      fVar119 = fVar119 - *(float *)(ray + 0x24);
                      fVar129 = fVar129 - *(float *)(ray + 0x28);
                      fVar132 = fVar132 - *(float *)(ray + 0x2c);
                      fVar149 = *(float *)(ray + 0x40);
                      fVar150 = *(float *)(ray + 0x44);
                      fVar151 = *(float *)(ray + 0x48);
                      fVar175 = *(float *)(ray + 0x4c);
                      fVar182 = *(float *)(ray + 0x50);
                      fVar183 = *(float *)(ray + 0x54);
                      fVar184 = *(float *)(ray + 0x58);
                      fVar185 = *(float *)(ray + 0x5c);
                      fVar102 = *(float *)(ray + 0x60);
                      fVar101 = *(float *)(ray + 100);
                      fVar106 = *(float *)(ray + 0x68);
                      fVar107 = *(float *)(ray + 0x6c);
                      uVar153 = local_19f8 * fVar102 - fVar143 * fVar182;
                      uVar156 = fStack_19f4 * fVar101 - fVar119 * fVar183;
                      uVar159 = fStack_19f0 * fVar106 - fVar129 * fVar184;
                      uVar162 = fStack_19ec * fVar107 - fVar132 * fVar185;
                      fVar120 = fVar143 * fVar149 - fVar71 * fVar102;
                      fVar126 = fVar119 * fVar150 - fVar83 * fVar101;
                      fVar128 = fVar129 * fVar151 - fVar84 * fVar106;
                      fVar130 = fVar132 * fVar175 - fVar85 * fVar107;
                      in_XMM10._0_4_ = fVar71 * fVar182 - local_19f8 * fVar149;
                      in_XMM10._4_4_ = fVar83 * fVar183 - fStack_19f4 * fVar150;
                      in_XMM10._8_4_ = fVar84 * fVar184 - fStack_19f0 * fVar151;
                      in_XMM10._12_4_ = fVar85 * fVar185 - fStack_19ec * fVar175;
                      fVar149 = fVar149 * fVar108 + fVar182 * fVar86 + fVar102 * fVar110;
                      fVar150 = fVar150 * fVar63 + fVar183 * fVar95 + fVar101 * fVar114;
                      fVar151 = fVar151 * fVar66 + fVar184 * fVar97 + fVar106 * fVar116;
                      fVar175 = fVar175 * fVar69 + fVar185 * fVar99 + fVar107 * fVar118;
                      uVar166 = (uint)fVar149 & 0x80000000;
                      uVar169 = (uint)fVar150 & 0x80000000;
                      uVar172 = (uint)fVar151 & 0x80000000;
                      uVar176 = (uint)fVar175 & 0x80000000;
                      fVar68 = (float)((uint)(fVar68 * (float)uVar153 +
                                             fVar115 * fVar120 + fVar138 * in_XMM10._0_4_) ^ uVar166
                                      );
                      fVar109 = (float)((uint)(fVar109 * (float)uVar156 +
                                              fVar125 * fVar126 + fVar152 * in_XMM10._4_4_) ^
                                       uVar169);
                      fVar141 = (float)((uint)(fVar141 * (float)uVar159 +
                                              fVar127 * fVar128 + fVar155 * in_XMM10._8_4_) ^
                                       uVar172);
                      fVar117 = (float)((uint)(fVar117 * (float)uVar162 +
                                              fVar135 * fVar130 + fVar158 * in_XMM10._12_4_) ^
                                       uVar176);
                      uVar179 = -(uint)(0.0 <= fVar68) & auVar103._0_4_;
                      uVar180 = -(uint)(0.0 <= fVar109) & auVar103._4_4_;
                      uVar181 = -(uint)(0.0 <= fVar141) & auVar103._8_4_;
                      uVar164 = -(uint)(0.0 <= fVar117) & auVar103._12_4_;
                      auVar20._4_4_ = uVar180;
                      auVar20._0_4_ = uVar179;
                      auVar20._8_4_ = uVar181;
                      auVar20._12_4_ = uVar164;
                      uVar34 = movmskps(uVar34,auVar20);
                      if (uVar34 != 0) {
                        fVar131 = (float)((uint)(fVar51 * (float)uVar153 +
                                                fVar161 * fVar120 + fVar131 * in_XMM10._0_4_) ^
                                         uVar166);
                        fVar134 = (float)((uint)(fVar62 * (float)uVar156 +
                                                fVar187 * fVar126 + fVar134 * in_XMM10._4_4_) ^
                                         uVar169);
                        fVar137 = (float)((uint)(fVar65 * (float)uVar159 +
                                                fVar189 * fVar128 + fVar137 * in_XMM10._8_4_) ^
                                         uVar172);
                        fVar140 = (float)((uint)(fVar113 * (float)uVar162 +
                                                fVar191 * fVar130 + fVar140 * in_XMM10._12_4_) ^
                                         uVar176);
                        uVar153 = -(uint)(0.0 <= fVar131) & uVar179;
                        uVar156 = -(uint)(0.0 <= fVar134) & uVar180;
                        uVar159 = -(uint)(0.0 <= fVar137) & uVar181;
                        uVar162 = -(uint)(0.0 <= fVar140) & uVar164;
                        auVar12._4_4_ = uVar156;
                        auVar12._0_4_ = uVar153;
                        auVar12._8_4_ = uVar159;
                        auVar12._12_4_ = uVar162;
                        uVar34 = movmskps(uVar34,auVar12);
                        if (uVar34 != 0) {
                          fVar182 = ABS(fVar149);
                          fVar183 = ABS(fVar150);
                          auVar147._0_8_ = CONCAT44(fVar150,fVar149) & 0x7fffffff7fffffff;
                          auVar147._8_4_ = ABS(fVar151);
                          auVar147._12_4_ = ABS(fVar175);
                          auVar76._0_4_ = -(uint)(fVar131 <= fVar182 - fVar68) & uVar153;
                          auVar76._4_4_ = -(uint)(fVar134 <= fVar183 - fVar109) & uVar156;
                          auVar76._8_4_ = -(uint)(fVar137 <= auVar147._8_4_ - fVar141) & uVar159;
                          auVar76._12_4_ = -(uint)(fVar140 <= auVar147._12_4_ - fVar117) & uVar162;
                          uVar34 = movmskps(uVar34,auVar76);
                          if (uVar34 != 0) {
                            fVar143 = (float)(uVar166 ^
                                             (uint)(fVar71 * fVar108 +
                                                   local_19f8 * fVar86 + fVar143 * fVar110));
                            fVar119 = (float)(uVar169 ^
                                             (uint)(fVar83 * fVar63 +
                                                   fStack_19f4 * fVar95 + fVar119 * fVar114));
                            fVar129 = (float)(uVar172 ^
                                             (uint)(fVar84 * fVar66 +
                                                   fStack_19f0 * fVar97 + fVar129 * fVar116));
                            fVar132 = (float)(uVar176 ^
                                             (uint)(fVar85 * fVar69 +
                                                   fStack_19ec * fVar99 + fVar132 * fVar118));
                            auVar205 = *(undefined1 (*) [16])(ray + 0x80);
                            in_XMM10._0_4_ = fVar182 * auVar205._0_4_;
                            in_XMM10._4_4_ = fVar183 * auVar205._4_4_;
                            in_XMM10._8_4_ = auVar147._8_4_ * auVar205._8_4_;
                            in_XMM10._12_4_ = auVar147._12_4_ * auVar205._12_4_;
                            uVar153 = -(uint)(fVar143 <= in_XMM10._0_4_ &&
                                             *(float *)(ray + 0x30) * fVar182 < fVar143) &
                                      auVar76._0_4_;
                            uVar156 = -(uint)(fVar119 <= in_XMM10._4_4_ &&
                                             *(float *)(ray + 0x34) * fVar183 < fVar119) &
                                      auVar76._4_4_;
                            uVar159 = -(uint)(fVar129 <= in_XMM10._8_4_ &&
                                             *(float *)(ray + 0x38) * auVar147._8_4_ < fVar129) &
                                      auVar76._8_4_;
                            uVar162 = -(uint)(fVar132 <= in_XMM10._12_4_ &&
                                             *(float *)(ray + 0x3c) * auVar147._12_4_ < fVar132) &
                                      auVar76._12_4_;
                            auVar13._4_4_ = uVar156;
                            auVar13._0_4_ = uVar153;
                            auVar13._8_4_ = uVar159;
                            auVar13._12_4_ = uVar162;
                            uVar34 = movmskps(uVar34,auVar13);
                            if (uVar34 != 0) {
                              auVar58._0_4_ = -(uint)(fVar149 != 0.0) & uVar153;
                              auVar58._4_4_ = -(uint)(fVar150 != 0.0) & uVar156;
                              auVar58._8_4_ = -(uint)(fVar151 != 0.0) & uVar159;
                              auVar58._12_4_ = -(uint)(fVar175 != 0.0) & uVar162;
                              uVar34 = movmskps(uVar34,auVar58);
                              if (uVar34 != 0) {
                                uVar34 = *(uint *)(lVar40 + 0x40 + uVar49 * 4);
                                pRVar7 = (context->scene->geometries).items;
                                pGVar5 = pRVar7[uVar34].ptr;
                                uVar166 = pGVar5->mask;
                                auVar77._0_4_ = -(uint)((uVar166 & *(uint *)(ray + 0x90)) == 0);
                                auVar77._4_4_ = -(uint)((uVar166 & *(uint *)(ray + 0x94)) == 0);
                                auVar77._8_4_ = -(uint)((uVar166 & *(uint *)(ray + 0x98)) == 0);
                                auVar77._12_4_ = -(uint)((uVar166 & *(uint *)(ray + 0x9c)) == 0);
                                aVar78 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                         (~auVar77 & auVar58);
                                iVar39 = movmskps((int)pRVar7,(undefined1  [16])aVar78);
                                if (iVar39 != 0) {
                                  vVar89.field_0.v[2] = fVar66;
                                  vVar89.field_0.v[3] = fVar69;
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar60 = rcpps(auVar58,auVar147);
                                    fVar149 = auVar60._0_4_;
                                    fVar150 = auVar60._4_4_;
                                    fVar151 = auVar60._8_4_;
                                    fVar175 = auVar60._12_4_;
                                    fVar184 = (float)DAT_01f7ba10;
                                    fVar185 = DAT_01f7ba10._4_4_;
                                    fVar51 = DAT_01f7ba10._8_4_;
                                    fVar62 = DAT_01f7ba10._12_4_;
                                    fVar149 = (fVar184 - fVar182 * fVar149) * fVar149 + fVar149;
                                    fVar150 = (fVar185 - fVar183 * fVar150) * fVar150 + fVar150;
                                    fVar151 = (fVar51 - auVar147._8_4_ * fVar151) * fVar151 +
                                              fVar151;
                                    fVar175 = (fVar62 - auVar147._12_4_ * fVar175) * fVar175 +
                                              fVar175;
                                    auVar199._0_4_ = fVar68 * fVar149;
                                    auVar199._4_4_ = fVar109 * fVar150;
                                    auVar199._8_4_ = fVar141 * fVar151;
                                    auVar199._12_4_ = fVar117 * fVar175;
                                    auVar54 = minps(auVar199,_DAT_01f7ba10);
                                    auVar123._0_4_ = fVar131 * fVar149;
                                    auVar123._4_4_ = fVar134 * fVar150;
                                    auVar123._8_4_ = fVar137 * fVar151;
                                    auVar123._12_4_ = fVar140 * fVar175;
                                    auVar60 = minps(auVar123,_DAT_01f7ba10);
                                    auVar148._0_4_ = fVar184 - auVar54._0_4_;
                                    auVar148._4_4_ = fVar185 - auVar54._4_4_;
                                    auVar148._8_4_ = fVar51 - auVar54._8_4_;
                                    auVar148._12_4_ = fVar62 - auVar54._12_4_;
                                    auVar24._8_8_ = uVar29;
                                    auVar24._0_8_ = uVar28;
                                    blendvps(auVar54,auVar148,auVar24);
                                    auVar16._4_4_ = fVar185 - auVar60._4_4_;
                                    auVar16._0_4_ = fVar184 - auVar60._0_4_;
                                    auVar16._8_4_ = fVar51 - auVar60._8_4_;
                                    auVar16._12_4_ = fVar62 - auVar60._12_4_;
                                    blendvps(auVar60,auVar16,auVar24);
                                    p0.field_0.field_0.x.field_0 =
                                         (vfloat_impl<4>)(vfloat_impl<4>)vVar89.field_0;
                                    vVar21.field_0.v[2] = fVar97;
                                    vVar21.field_0.v[3] = fVar99;
                                    p0.field_0.field_0.y.field_0 =
                                         (vfloat_impl<4>)(vfloat_impl<4>)vVar21.field_0;
                                    p0.field_0._36_4_ = fVar114;
                                    p0.field_0._32_4_ = fVar110;
                                    p0.field_0._44_4_ = fVar118;
                                    p0.field_0._40_4_ = fVar116;
                                    uVar153 = fVar149 * fVar143;
                                    uVar156 = fVar150 * fVar119;
                                    uVar159 = fVar151 * fVar129;
                                    uVar162 = fVar175 * fVar132;
                                    auVar14._4_4_ = uVar156;
                                    auVar14._0_4_ = uVar153;
                                    auVar14._8_4_ = uVar159;
                                    auVar14._12_4_ = uVar162;
                                    auVar60 = blendvps(auVar205,auVar14,(undefined1  [16])aVar78);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar60;
                                    itime.field_0 = aVar78;
                                    p1.field_0._0_8_ = &itime;
                                    p1.field_0._8_8_ = pGVar5->userPtr;
                                    p1.field_0._16_8_ = context->user;
                                    p1.field_0._24_8_ = ray;
                                    p1.field_0._32_8_ = &p0;
                                    p1.field_0._40_4_ = 4;
                                    uVar38 = pGVar5->occlusionFilterN;
                                    if ((RTCFilterFunctionN)uVar38 != (RTCFilterFunctionN)0x0) {
                                      valid_i = (vint<4> *)&p1;
                                      uVar38 = (*(code *)uVar38)((RTCFilterFunctionNArguments *)
                                                                 valid_i);
                                    }
                                    if (itime.field_0 ==
                                        (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                      auVar90._8_4_ = 0xffffffff;
                                      auVar90._0_8_ = 0xffffffffffffffff;
                                      auVar90._12_4_ = 0xffffffff;
                                      auVar90 = auVar90 ^ _DAT_01f7ae20;
                                    }
                                    else {
                                      p_Var8 = context->args->filter;
                                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                        valid_i = (vint<4> *)&p1;
                                        (*p_Var8)((RTCFilterFunctionNArguments *)valid_i);
                                      }
                                      auVar81._0_4_ = -(uint)(itime.field_0._0_4_ == 0);
                                      auVar81._4_4_ = -(uint)(itime.field_0._4_4_ == 0);
                                      auVar81._8_4_ = -(uint)(itime.field_0._8_4_ == 0);
                                      auVar81._12_4_ = -(uint)(itime.field_0._12_4_ == 0);
                                      auVar90 = auVar81 ^ _DAT_01f7ae20;
                                      auVar60 = blendvps(_DAT_01f7aa00,
                                                         *(undefined1 (*) [16])
                                                          (p1.field_0._24_8_ + 0x80),auVar81);
                                      *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar60;
                                      uVar38 = p1.field_0._24_8_;
                                    }
                                    uVar34 = (uint)uVar38;
                                    auVar93._0_4_ = auVar90._0_4_ << 0x1f;
                                    auVar93._4_4_ = auVar90._4_4_ << 0x1f;
                                    auVar93._8_4_ = auVar90._8_4_ << 0x1f;
                                    auVar93._12_4_ = auVar90._12_4_ << 0x1f;
                                    aVar78._0_4_ = auVar93._0_4_ >> 0x1f;
                                    aVar78._4_4_ = auVar93._4_4_ >> 0x1f;
                                    aVar78._8_4_ = auVar93._8_4_ >> 0x1f;
                                    aVar78._12_4_ = auVar93._12_4_ >> 0x1f;
                                    auVar205 = blendvps(auVar205,*(undefined1 (*) [16])(ray + 0x80),
                                                        auVar93);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar205;
                                  }
                                  auVar103 = ~(undefined1  [16])aVar78 & auVar103;
                                }
                              }
                            }
                          }
                        }
                      }
                      uVar34 = movmskps(uVar34,auVar103);
                      uVar37 = (ulong)uVar34;
                      aVar207 = _DAT_01f7a9f0;
                      local_1978 = fVar161;
                      fStack_1974 = fVar187;
                      fStack_1970 = fVar189;
                      fStack_196c = fVar191;
                      if ((uVar34 == 0) ||
                         (uVar37 = uVar49 + 1, bVar50 = 2 < uVar49, uVar49 = uVar37, bVar50)) break;
                    }
                    auVar124._0_4_ = auVar122._0_4_ & auVar103._0_4_;
                    auVar124._4_4_ = auVar122._4_4_ & auVar103._4_4_;
                    auVar124._8_4_ = auVar122._8_4_ & auVar103._8_4_;
                    auVar124._12_4_ = auVar122._12_4_ & auVar103._12_4_;
                    iVar39 = movmskps((int)uVar37,auVar124);
                  } while ((iVar39 != 0) &&
                          (uVar35 = uVar35 + 1, auVar122 = auVar124, uVar35 < uVar36));
                  uVar36 = CONCAT44(auVar124._4_4_,auVar124._0_4_);
                  terminated.field_0._0_8_ = uVar36 ^ 0xffffffffffffffff;
                  terminated.field_0.i[2] = auVar124._8_4_ ^ 0xffffffff;
                  terminated.field_0.i[3] = auVar124._12_4_ ^ 0xffffffff;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])vVar30.field_0 | (undefined1  [16])terminated.field_0);
                uVar32 = movmskps((int)uVar35,(undefined1  [16])terminated.field_0);
                if (uVar32 == 0xf) goto LAB_0023a98c;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_002393f4;
            }
            uVar35 = root.ptr & 0xfffffffffffffff0;
            lVar40 = -0x10;
            root.ptr = 8;
            aVar87 = aVar207;
            do {
              sVar4 = *(size_t *)(uVar35 + 0x20 + lVar40 * 2);
              if (sVar4 == 8) break;
              fVar68 = *(float *)(uVar35 + 0x90 + lVar40);
              fVar109 = *(float *)(uVar35 + 0x30 + lVar40);
              fVar141 = *(float *)(uVar35 + 0x40 + lVar40);
              fVar117 = *(float *)(uVar35 + 0x50 + lVar40);
              fVar143 = *(float *)(uVar35 + 0x60 + lVar40);
              fVar182 = *(float *)(ray + 0x70);
              fVar183 = *(float *)(ray + 0x74);
              fVar184 = *(float *)(ray + 0x78);
              fVar185 = *(float *)(ray + 0x7c);
              fVar119 = *(float *)(uVar35 + 0xb0 + lVar40);
              fVar129 = *(float *)(uVar35 + 0xd0 + lVar40);
              fVar132 = *(float *)(uVar35 + 0x70 + lVar40);
              fVar149 = *(float *)(uVar35 + 0xa0 + lVar40);
              fVar150 = *(float *)(uVar35 + 0xc0 + lVar40);
              fVar151 = *(float *)(uVar35 + 0xe0 + lVar40);
              fVar175 = *(float *)(uVar35 + 0x80 + lVar40);
              fVar51 = ((fVar68 * fVar182 + fVar109) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar62 = ((fVar68 * fVar183 + fVar109) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar65 = ((fVar68 * fVar184 + fVar109) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar68 = ((fVar68 * fVar185 + fVar109) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar109 = ((fVar119 * fVar182 + fVar117) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar113 = ((fVar119 * fVar183 + fVar117) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar115 = ((fVar119 * fVar184 + fVar117) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar117 = ((fVar119 * fVar185 + fVar117) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar119 = ((fVar129 * fVar182 + fVar132) - (float)tray.org.field_0._32_4_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar125 = ((fVar129 * fVar183 + fVar132) - (float)tray.org.field_0._36_4_) *
                        (float)tray.rdir.field_0._36_4_;
              fVar127 = ((fVar129 * fVar184 + fVar132) - (float)tray.org.field_0._40_4_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar129 = ((fVar129 * fVar185 + fVar132) - (float)tray.org.field_0._44_4_) *
                        (float)tray.rdir.field_0._44_4_;
              fVar132 = ((fVar149 * fVar182 + fVar141) - (float)tray.org.field_0._0_4_) *
                        (float)tray.rdir.field_0._0_4_;
              fVar135 = ((fVar149 * fVar183 + fVar141) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar138 = ((fVar149 * fVar184 + fVar141) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar141 = ((fVar149 * fVar185 + fVar141) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar152 = ((fVar150 * fVar182 + fVar143) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar155 = ((fVar150 * fVar183 + fVar143) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar158 = ((fVar150 * fVar184 + fVar143) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar161 = ((fVar150 * fVar185 + fVar143) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar143 = ((fVar151 * fVar182 + fVar175) - (float)tray.org.field_0._32_4_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar149 = ((fVar151 * fVar183 + fVar175) - (float)tray.org.field_0._36_4_) *
                        (float)tray.rdir.field_0._36_4_;
              fVar150 = ((fVar151 * fVar184 + fVar175) - (float)tray.org.field_0._40_4_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar151 = ((fVar151 * fVar185 + fVar175) - (float)tray.org.field_0._44_4_) *
                        (float)tray.rdir.field_0._44_4_;
              uVar32 = (uint)((int)fVar132 < (int)fVar51) * (int)fVar132 |
                       (uint)((int)fVar132 >= (int)fVar51) * (int)fVar51;
              uVar166 = (uint)((int)fVar135 < (int)fVar62) * (int)fVar135 |
                        (uint)((int)fVar135 >= (int)fVar62) * (int)fVar62;
              uVar169 = (uint)((int)fVar138 < (int)fVar65) * (int)fVar138 |
                        (uint)((int)fVar138 >= (int)fVar65) * (int)fVar65;
              uVar172 = (uint)((int)fVar141 < (int)fVar68) * (int)fVar141 |
                        (uint)((int)fVar141 >= (int)fVar68) * (int)fVar68;
              uVar176 = (uint)((int)fVar152 < (int)fVar109) * (int)fVar152 |
                        (uint)((int)fVar152 >= (int)fVar109) * (int)fVar109;
              uVar179 = (uint)((int)fVar155 < (int)fVar113) * (int)fVar155 |
                        (uint)((int)fVar155 >= (int)fVar113) * (int)fVar113;
              uVar180 = (uint)((int)fVar158 < (int)fVar115) * (int)fVar158 |
                        (uint)((int)fVar158 >= (int)fVar115) * (int)fVar115;
              uVar181 = (uint)((int)fVar161 < (int)fVar117) * (int)fVar161 |
                        (uint)((int)fVar161 >= (int)fVar117) * (int)fVar117;
              in_XMM10._0_4_ =
                   (float)(((int)uVar176 < (int)uVar32) * uVar32 |
                          ((int)uVar176 >= (int)uVar32) * uVar176);
              in_XMM10._4_4_ =
                   (float)(((int)uVar179 < (int)uVar166) * uVar166 |
                          ((int)uVar179 >= (int)uVar166) * uVar179);
              in_XMM10._8_4_ =
                   (float)(((int)uVar180 < (int)uVar169) * uVar169 |
                          ((int)uVar180 >= (int)uVar169) * uVar180);
              in_XMM10._12_4_ =
                   (float)(((int)uVar181 < (int)uVar172) * uVar172 |
                          ((int)uVar181 >= (int)uVar172) * uVar181);
              uVar32 = (uint)((int)fVar143 < (int)fVar119) * (int)fVar143 |
                       (uint)((int)fVar143 >= (int)fVar119) * (int)fVar119;
              uVar166 = (uint)((int)fVar149 < (int)fVar125) * (int)fVar149 |
                        (uint)((int)fVar149 >= (int)fVar125) * (int)fVar125;
              uVar169 = (uint)((int)fVar150 < (int)fVar127) * (int)fVar150 |
                        (uint)((int)fVar150 >= (int)fVar127) * (int)fVar127;
              uVar172 = (uint)((int)fVar151 < (int)fVar129) * (int)fVar151 |
                        (uint)((int)fVar151 >= (int)fVar129) * (int)fVar129;
              uVar164 = (uint)((int)uVar32 < (int)in_XMM10._0_4_) * (int)in_XMM10._0_4_ |
                        ((int)uVar32 >= (int)in_XMM10._0_4_) * uVar32;
              uVar167 = (uint)((int)uVar166 < (int)in_XMM10._4_4_) * (int)in_XMM10._4_4_ |
                        ((int)uVar166 >= (int)in_XMM10._4_4_) * uVar166;
              uVar170 = (uint)((int)uVar169 < (int)in_XMM10._8_4_) * (int)in_XMM10._8_4_ |
                        ((int)uVar169 >= (int)in_XMM10._8_4_) * uVar169;
              uVar173 = (uint)((int)uVar172 < (int)in_XMM10._12_4_) * (int)in_XMM10._12_4_ |
                        ((int)uVar172 >= (int)in_XMM10._12_4_) * uVar172;
              uVar32 = (uint)((int)fVar132 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar132 >= (int)fVar51) * (int)fVar132;
              uVar166 = (uint)((int)fVar135 < (int)fVar62) * (int)fVar62 |
                        (uint)((int)fVar135 >= (int)fVar62) * (int)fVar135;
              uVar169 = (uint)((int)fVar138 < (int)fVar65) * (int)fVar65 |
                        (uint)((int)fVar138 >= (int)fVar65) * (int)fVar138;
              uVar172 = (uint)((int)fVar141 < (int)fVar68) * (int)fVar68 |
                        (uint)((int)fVar141 >= (int)fVar68) * (int)fVar141;
              uVar176 = (uint)((int)fVar152 < (int)fVar109) * (int)fVar109 |
                        (uint)((int)fVar152 >= (int)fVar109) * (int)fVar152;
              uVar179 = (uint)((int)fVar155 < (int)fVar113) * (int)fVar113 |
                        (uint)((int)fVar155 >= (int)fVar113) * (int)fVar155;
              uVar180 = (uint)((int)fVar158 < (int)fVar115) * (int)fVar115 |
                        (uint)((int)fVar158 >= (int)fVar115) * (int)fVar158;
              uVar181 = (uint)((int)fVar161 < (int)fVar117) * (int)fVar117 |
                        (uint)((int)fVar161 >= (int)fVar117) * (int)fVar161;
              uVar153 = ((int)uVar32 < (int)uVar176) * uVar32 |
                        ((int)uVar32 >= (int)uVar176) * uVar176;
              uVar156 = ((int)uVar166 < (int)uVar179) * uVar166 |
                        ((int)uVar166 >= (int)uVar179) * uVar179;
              uVar159 = ((int)uVar169 < (int)uVar180) * uVar169 |
                        ((int)uVar169 >= (int)uVar180) * uVar180;
              uVar162 = ((int)uVar172 < (int)uVar181) * uVar172 |
                        ((int)uVar172 >= (int)uVar181) * uVar181;
              uVar32 = (uint)((int)fVar143 < (int)fVar119) * (int)fVar119 |
                       (uint)((int)fVar143 >= (int)fVar119) * (int)fVar143;
              uVar166 = (uint)((int)fVar149 < (int)fVar125) * (int)fVar125 |
                        (uint)((int)fVar149 >= (int)fVar125) * (int)fVar149;
              uVar169 = (uint)((int)fVar150 < (int)fVar127) * (int)fVar127 |
                        (uint)((int)fVar150 >= (int)fVar127) * (int)fVar150;
              uVar172 = (uint)((int)fVar151 < (int)fVar129) * (int)fVar129 |
                        (uint)((int)fVar151 >= (int)fVar129) * (int)fVar151;
              uVar32 = (uint)((int)uVar153 < (int)uVar32) * uVar153 |
                       ((int)uVar153 >= (int)uVar32) * uVar32;
              uVar166 = (uint)((int)uVar156 < (int)uVar166) * uVar156 |
                        ((int)uVar156 >= (int)uVar166) * uVar166;
              uVar169 = (uint)((int)uVar159 < (int)uVar169) * uVar159 |
                        ((int)uVar159 >= (int)uVar169) * uVar169;
              uVar172 = (uint)((int)uVar162 < (int)uVar172) * uVar162 |
                        ((int)uVar162 >= (int)uVar172) * uVar172;
              bVar50 = (float)((tray.tnear.field_0.i[0] < (int)uVar164) * uVar164 |
                              (uint)(tray.tnear.field_0.i[0] >= (int)uVar164) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar32) * tray.tfar.field_0.i[0]
                              | (tray.tfar.field_0.i[0] >= (int)uVar32) * uVar32);
              bVar9 = (float)((tray.tnear.field_0.i[1] < (int)uVar167) * uVar167 |
                             (uint)(tray.tnear.field_0.i[1] >= (int)uVar167) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar166) * tray.tfar.field_0.i[1]
                             | (tray.tfar.field_0.i[1] >= (int)uVar166) * uVar166);
              bVar10 = (float)((tray.tnear.field_0.i[2] < (int)uVar170) * uVar170 |
                              (uint)(tray.tnear.field_0.i[2] >= (int)uVar170) *
                              tray.tnear.field_0.i[2]) <=
                       (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar169) *
                               tray.tfar.field_0.i[2] |
                              (tray.tfar.field_0.i[2] >= (int)uVar169) * uVar169);
              bVar11 = (float)((tray.tnear.field_0.i[3] < (int)uVar173) * uVar173 |
                              (uint)(tray.tnear.field_0.i[3] >= (int)uVar173) *
                              tray.tnear.field_0.i[3]) <=
                       (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar172) *
                               tray.tfar.field_0.i[3] |
                              (tray.tfar.field_0.i[3] >= (int)uVar172) * uVar172);
              if ((uVar34 & 7) == 6) {
                fVar68 = *(float *)(uVar35 + 0xf0 + lVar40);
                fVar109 = *(float *)(uVar35 + 0x100 + lVar40);
                bVar50 = (fVar182 < fVar109 && fVar68 <= fVar182) && bVar50;
                bVar9 = (fVar183 < fVar109 && fVar68 <= fVar183) && bVar9;
                bVar10 = (fVar184 < fVar109 && fVar68 <= fVar184) && bVar10;
                bVar11 = (fVar185 < fVar109 && fVar68 <= fVar185) && bVar11;
              }
              auVar55._0_4_ = (-(uint)bVar50 & -(uint)(fVar131 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar55._4_4_ = (-(uint)bVar9 & -(uint)(fVar134 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar55._8_4_ = (-(uint)bVar10 & -(uint)(fVar137 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar55._12_4_ = (-(uint)bVar11 & -(uint)(fVar140 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar32 = movmskps((int)valid_i,auVar55);
              valid_i = (vint<4> *)(ulong)uVar32;
              sVar31 = root.ptr;
              aVar104 = aVar87;
              if ((uVar32 != 0) &&
                 (auVar15._4_4_ = uVar167, auVar15._0_4_ = uVar164, auVar15._8_4_ = uVar170,
                 auVar15._12_4_ = uVar173, aVar104.v = (__m128)blendvps(aVar207.v,auVar15,auVar55),
                 sVar31 = sVar4, root.ptr != 8)) {
                pNVar48->ptr = root.ptr;
                pNVar48 = pNVar48 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar41->v = aVar87;
                paVar41 = paVar41 + 1;
              }
              aVar87 = aVar104;
              root.ptr = sVar31;
              lVar40 = lVar40 + 4;
            } while (lVar40 != 0);
            if (root.ptr == 8) goto LAB_002396b2;
            auVar56._4_4_ = -(uint)(aVar87.v[1] < tray.tfar.field_0.v[1]);
            auVar56._0_4_ = -(uint)(aVar87.v[0] < tray.tfar.field_0.v[0]);
            auVar56._8_4_ = -(uint)(aVar87.v[2] < tray.tfar.field_0.v[2]);
            auVar56._12_4_ = -(uint)(aVar87.v[3] < tray.tfar.field_0.v[3]);
            uVar33 = movmskps((int)uVar35,auVar56);
            uVar32 = POPCOUNT(uVar33);
          } while ((byte)uVar43 < (byte)uVar32);
          pNVar48->ptr = root.ptr;
          pNVar48 = pNVar48 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar41->v = aVar87;
          paVar41 = paVar41 + 1;
LAB_002396b2:
          uVar32 = 4;
        }
        else {
          do {
            sVar4 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> sVar4 & 1) == 0; sVar4 = sVar4 + 1) {
              }
            }
            tray_00 = &tray;
            valid_i = (vint<4> *)This;
            bVar50 = occluded1(This,bvh,root,sVar4,&pre,ray,tray_00,context);
            if (bVar50) {
              terminated.field_0.i[sVar4] = -1;
            }
            uVar35 = uVar35 & uVar35 - 1;
          } while (uVar35 != 0);
          iVar39 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          uVar32 = 3;
          if (iVar39 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar32 = 2;
          }
          aVar207 = _DAT_01f7a9f0;
          if (uVar43 < (uint)POPCOUNT(uVar34)) goto LAB_00239434;
        }
      } while (uVar32 != 3);
LAB_0023a98c:
      auVar61._0_4_ = auVar72._0_4_ & terminated.field_0.i[0];
      auVar61._4_4_ = auVar72._4_4_ & terminated.field_0.i[1];
      auVar61._8_4_ = auVar72._8_4_ & terminated.field_0.i[2];
      auVar61._12_4_ = auVar72._12_4_ & terminated.field_0.i[3];
      auVar103 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar61);
      *(undefined1 (*) [16])(ray + 0x80) = auVar103;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }